

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependVarConstant
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,Var var)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int32 value_00;
  uint32 uVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  RecyclableObject *this_00;
  JavascriptBoolean *this_01;
  double value_01;
  byte local_9d;
  byte local_71;
  uint32 size_5;
  uint32 size_4;
  uint32 size_3;
  uint32 size_2;
  uint32 size_1;
  int32 value;
  uint32 size;
  TypeId typeId;
  Var var_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  TypeId local_18;
  TypeId typeId_1;
  
  if ((undefined8 *)var == &NullFrameDisplay) {
    this_local._4_4_ = PrependByte(this,builder,L"Null Frame Display",'\t');
  }
  else if ((undefined8 *)var == &StrictNullFrameDisplay) {
    this_local._4_4_ = PrependByte(this,builder,L"Strict Null Frame Display",'\n');
  }
  else {
    if (var == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = TaggedInt::Is(var);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(var);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        this_00 = UnsafeVarTo<Js::RecyclableObject>(var);
        if (this_00 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_18 = RecyclableObject::GetTypeId(this_00);
        if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this_00), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    switch(local_18) {
    case TypeIds_Undefined:
      this_local._4_4_ = PrependByte(this,builder,L"Undefined Constant",'\b');
      break;
    case TypeIds_Null:
      this_local._4_4_ = PrependByte(this,builder,L"Null Constant",'\a');
      break;
    case TypeIds_Boolean:
      this_01 = VarTo<Js::JavascriptBoolean>(var);
      BVar3 = JavascriptBoolean::GetValue(this_01);
      local_71 = '\v';
      if (BVar3 == 0) {
        local_71 = '\f';
      }
      this_local._4_4_ = PrependByte(this,builder,L"Boolean Constant",local_71);
      break;
    case TypeIds_FirstNumberType:
      value_00 = TaggedInt::ToInt32(var);
      if ((char)(byte)value_00 == value_00) {
        uVar4 = PrependByte(this,builder,L"Integer Constant",'\x01');
        uVar5 = PrependByte(this,builder,L"Integer Constant Value",(byte)value_00);
        this_local._4_4_ = uVar4 + uVar5;
      }
      else if ((short)value_00 == value_00) {
        uVar4 = PrependByte(this,builder,L"Integer Constant",'\x02');
        uVar5 = PrependConstantInt16
                          (this,builder,L"Integer Constant Value",(short)value_00,
                           (ConstantSizedBufferBuilderOf<short> **)0x0);
        this_local._4_4_ = uVar4 + uVar5;
      }
      else {
        uVar4 = PrependByte(this,builder,L"Integer Constant",'\x03');
        uVar5 = PrependConstantInt32
                          (this,builder,L"Integer Constant Value",value_00,
                           (ConstantSizedBufferBuilderOf<int> **)0x0);
        this_local._4_4_ = uVar4 + uVar5;
      }
      break;
    case TypeIds_Number:
      uVar4 = PrependByte(this,builder,L"Number Constant",'\x04');
      value_01 = JavascriptNumber::GetValue(var);
      uVar5 = PrependDouble(this,builder,L"Number Constant Value",value_01);
      this_local._4_4_ = uVar4 + uVar5;
      break;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x62e,"((0))","Unexpected object type in AddConstantTable");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      Throw::FatalInternalError(-0x7fffbffb);
    case TypeIds_String:
      bVar2 = VarIs<Js::PropertyString>(var);
      local_9d = '\x06';
      if (!bVar2) {
        local_9d = '\x05';
      }
      uVar4 = PrependByte(this,builder,L"String Constant 16",local_9d);
      uVar5 = PrependStringConstant(this,builder,var);
      this_local._4_4_ = uVar4 + uVar5;
      break;
    case TypeIds_ArrayLastWithES5:
      uVar4 = PrependByte(this,builder,L"String Template Callsite Constant",'\r');
      uVar5 = PrependStringTemplateCallsiteConstant(this,builder,var);
      this_local._4_4_ = uVar4 + uVar5;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32 PrependVarConstant(BufferBuilderList & builder, Var var)
    {
        if (var == (Js::Var)&Js::NullFrameDisplay)
        {
            return PrependByte(builder, _u("Null Frame Display"), ctNullDisplay);
        }
        else if (var == (Js::Var)&Js::StrictNullFrameDisplay)
        {
            return PrependByte(builder, _u("Strict Null Frame Display"), ctStrictNullDisplay);
        }

        auto typeId = JavascriptOperators::GetTypeId(var);
        switch (typeId)
        {
        case TypeIds_Undefined:
            return PrependByte(builder, _u("Undefined Constant"), ctUndefined);

        case TypeIds_Null:
            return PrependByte(builder, _u("Null Constant"), ctNull);

        case TypeIds_Boolean:
            return PrependByte(builder, _u("Boolean Constant"), VarTo<JavascriptBoolean>(var)->GetValue()? ctTrue : ctFalse);

        case TypeIds_Number:
        {
            auto size = PrependByte(builder, _u("Number Constant"), ctNumber);
            return size + PrependDouble(builder,  _u("Number Constant Value"), JavascriptNumber::GetValue(var));
        }

        case TypeIds_Integer:
        {
            int32 value = TaggedInt::ToInt32(var);
            if ((int8)value == value)
            {
                auto size = PrependByte(builder, _u("Integer Constant"), ctInt8);
                return size + PrependByte(builder, _u("Integer Constant Value"), (byte)value);
            }
            else if ((int16)value == value)
            {
                auto size = PrependByte(builder, _u("Integer Constant"), ctInt16);
                return size + PrependConstantInt16(builder, _u("Integer Constant Value"), (int16)value);
            }
            else
            {
                auto size = PrependByte(builder, _u("Integer Constant"), ctInt32);
                return size + PrependConstantInt32(builder, _u("Integer Constant Value"), value);
            }
        }

        case TypeIds_String:
        {
            auto size = PrependByte(builder, _u("String Constant 16"),
                Js::VarIs<Js::PropertyString>(var)? ctPropertyString16 : ctString16);
            return size + PrependStringConstant(builder, var);
        }

        case TypeIds_ES5Array:
        {
            // ES5Array objects in the constant table are always string template callsite objects.
            // If we later put other ES5Array objects in the constant table, we'll need another way
            // to decide the constant type.
            auto size = PrependByte(builder, _u("String Template Callsite Constant"), ctStringTemplateCallsite);
            return size + PrependStringTemplateCallsiteConstant(builder, var);
        }

        default:
            AssertMsg(UNREACHED, "Unexpected object type in AddConstantTable");
            Throw::FatalInternalError();
        }
    }